

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigStop(Ivy_FraigMan_t *p)

{
  Vec_Ptr_t *__ptr;
  int level;
  FILE *pFVar1;
  
  if (p->pParams->fVerbose != 0) {
    printf("SimWords = %d. Rounds = %d. Mem = %0.2f MB.  ",
           (double)p->nSimWords * (double)(p->pManAig->nCreated - p->pManAig->nDeleted) * 4.0 *
           9.5367431640625e-07,(ulong)(uint)p->nSimWords,(ulong)(uint)p->nSimRounds);
    printf("Classes: Beg = %d. End = %d.\n",(ulong)(uint)p->nClassesBeg,(ulong)(uint)p->nClassesEnd)
    ;
    printf("Proof = %d. Counter-example = %d. Fail = %d. FailReal = %d. Zero = %d.\n",
           (ulong)(uint)p->nSatProof,(ulong)(uint)p->nSatCallsSat,(ulong)(uint)p->nSatFails,
           (ulong)(uint)p->nSatFailsReal,(ulong)(uint)p->nClassesZero);
    level = 0xa5a825;
    printf("Final = %d. Miter = %d. Total = %d. Mux = %d. (Exor = %d.) SatVars = %d.\n",
           (ulong)(uint)(p->pManFraig->nObjs[6] + p->pManFraig->nObjs[5]),
           (ulong)(uint)p->nNodesMiter,(ulong)(uint)(p->pManAig->nObjs[6] + p->pManAig->nObjs[5]),0,
           0,p->nSatVars);
    if (p->pSat != (sat_solver *)0x0) {
      pFVar1 = _stdout;
      Sat_SolverPrintStats(_stdout,p->pSat);
      level = (int)pFVar1;
    }
    Abc_Print(level,"%s =","AIG simulation  ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeSim / 1000000.0);
    Abc_Print(level,"%s =","AIG traversal   ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeTrav / 1000000.0);
    Abc_Print(level,"%s =","SAT solving     ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeSat / 1000000.0);
    Abc_Print(level,"%s =","    Unsat       ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeSatUnsat / 1000000.0);
    Abc_Print(level,"%s =","    Sat         ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeSatSat / 1000000.0);
    Abc_Print(level,"%s =","    Fail        ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeSatFail / 1000000.0);
    Abc_Print(level,"%s =","Class refining  ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeRef / 1000000.0);
    Abc_Print(level,"%s =","TOTAL RUNTIME   ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
    if (p->time1 != 0) {
      Abc_Print(level,"%s =","time1           ");
      Abc_Print(level,"%9.2f sec\n",(double)p->time1 / 1000000.0);
    }
  }
  __ptr = p->vPiVars;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->pPatScores != (int *)0x0) {
    free(p->pPatScores);
    p->pPatScores = (int *)0x0;
  }
  if (p->pPatWords != (uint *)0x0) {
    free(p->pPatWords);
    p->pPatWords = (uint *)0x0;
  }
  if (p->pSimWords != (char *)0x0) {
    free(p->pSimWords);
  }
  free(p);
  return;
}

Assistant:

void Ivy_FraigStop( Ivy_FraigMan_t * p )
{
    if ( p->pParams->fVerbose )
        Ivy_FraigPrint( p );
    if ( p->vPiVars ) Vec_PtrFree( p->vPiVars );
    if ( p->pSat ) sat_solver_delete( p->pSat );
    ABC_FREE( p->pPatScores );
    ABC_FREE( p->pPatWords );
    ABC_FREE( p->pSimWords );
    ABC_FREE( p );
}